

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
::find<std::__cxx11::string>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key)

{
  uint64_t uVar1;
  ulong uVar2;
  iterator iVar3;
  
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
              *)this);
  uVar2 = key->_M_string_length;
  uVar1 = hash_internal::MixingHashState::CombineContiguousImpl
                    (&hash_internal::MixingHashState::kSeed,(key->_M_dataplus)._M_p,uVar2);
  uVar2 = (uVar2 ^ uVar1) * -0x234dd359734ecb13;
  iVar3 = find_non_soo<std::__cxx11::string>
                    (this,key,uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                              (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                              (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                              (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38);
  return iVar3;
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertOnFind(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }